

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O2

void __thiscall TEST_MockSupportTest_tracing_Test::testBody(TEST_MockSupportTest_tracing_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  UtestShell *pUVar4;
  char *pcVar5;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40;
  SimpleString local_30;
  SimpleString local_20;
  
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x23])(pMVar2,1);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_20,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_20);
  SimpleString::SimpleString(&local_30,"double");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x70))
                             (0x3ff0000000000000,(long *)CONCAT44(extraout_var,iVar1),&local_30);
  SimpleString::SimpleString(&local_40,"int");
  plVar3 = (long *)(**(code **)(*plVar3 + 0x40))(plVar3,&local_40,1);
  SimpleString::SimpleString(&local_50,"string");
  (**(code **)(*plVar3 + 0x78))(plVar3,&local_50,"string");
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(&local_20);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"scope");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_20,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_20);
  SimpleString::SimpleString(&local_30,"double");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x70))
                             (0x3ff0000000000000,(long *)CONCAT44(extraout_var_00,iVar1),&local_30);
  SimpleString::SimpleString(&local_40,"int");
  plVar3 = (long *)(**(code **)(*plVar3 + 0x40))(plVar3,&local_40,1);
  SimpleString::SimpleString(&local_50,"string");
  (**(code **)(*plVar3 + 0x78))(plVar3,&local_50,"string");
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_40);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(&local_20);
  SimpleString::~SimpleString(&local_60);
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_60);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  pcVar5 = MockSupport::getTraceOutput(pMVar2);
  (*pUVar4->_vptr_UtestShell[0xc])
            (pUVar4,"boo",pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
             ,0x9b);
  SimpleString::~SimpleString(&local_60);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_60,"");
  pMVar2 = mock(&local_60,(MockFailureReporter *)0x0);
  pcVar5 = MockSupport::getTraceOutput(pMVar2);
  (*pUVar4->_vptr_UtestShell[0xc])
            (pUVar4,"foo",pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupportTest.cpp"
             ,0x9c);
  SimpleString::~SimpleString(&local_60);
  return;
}

Assistant:

TEST(MockSupportTest, tracing)
{
    mock().tracing(true);

    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", 1).withParameter("string", "string");
    mock("scope").actualCall("foo").withParameter("double", 1.0).withParameter("int", 1).withParameter("string", "string");
    mock().checkExpectations();

    STRCMP_CONTAINS("boo", mock().getTraceOutput());
    STRCMP_CONTAINS("foo", mock().getTraceOutput());
}